

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

ElementObserverListBackInserter * __thiscall
Rml::ElementObserverListBackInserter::operator=
          (ElementObserverListBackInserter *this,Element *element)

{
  vector<Rml::ObserverPtr<Rml::Element>,std::allocator<Rml::ObserverPtr<Rml::Element>>> *this_00;
  EnableObserverPtr<Rml::Element> local_20;
  
  this_00 = (vector<Rml::ObserverPtr<Rml::Element>,std::allocator<Rml::ObserverPtr<Rml::Element>>> *
            )this->elements;
  EnableObserverPtr<Rml::Element>::GetObserverPtr(&local_20);
  ::std::vector<Rml::ObserverPtr<Rml::Element>,std::allocator<Rml::ObserverPtr<Rml::Element>>>::
  emplace_back<Rml::ObserverPtr<Rml::Element>>(this_00,(ObserverPtr<Rml::Element> *)&local_20);
  ObserverPtr<Rml::Element>::reset((ObserverPtr<Rml::Element> *)&local_20);
  return this;
}

Assistant:

ElementObserverListBackInserter& operator=(Element* element)
	{
		elements->push_back(element->GetObserverPtr());
		return *this;
	}